

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

int SSE8x8_SSE2(uint8_t *a,uint8_t *b)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i a0;
  int32_t tmp [4];
  __m128i sum;
  int num_pairs;
  __m128i zero;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_21c;
  undefined8 *local_208;
  undefined8 *local_200;
  byte local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  byte bStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  byte local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  byte bStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  byte local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  byte bStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  byte local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  byte bStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  __m128i sum01;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  
  local_21c = 4;
  local_208 = in_RSI;
  local_200 = in_RDI;
  while (0 < local_21c) {
    uVar1 = *local_200;
    local_98 = (byte)uVar1;
    uStack_97 = (undefined1)((ulong)uVar1 >> 8);
    uStack_96 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_95 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_94 = (byte)((ulong)uVar1 >> 0x20);
    uStack_93 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_92 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_91 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar1 = local_200[4];
    local_b8 = (byte)uVar1;
    uStack_b7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_b6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_b5 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_b4 = (byte)((ulong)uVar1 >> 0x20);
    uStack_b3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_b2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_b1 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar1 = *local_208;
    local_d8 = (byte)uVar1;
    uStack_d7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_d6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_d5 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_d4 = (byte)((ulong)uVar1 >> 0x20);
    uStack_d3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_d2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_d1 = (undefined1)((ulong)uVar1 >> 0x38);
    uVar1 = local_208[4];
    local_f8 = (byte)uVar1;
    uStack_f7 = (undefined1)((ulong)uVar1 >> 8);
    uStack_f6 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_f5 = (undefined1)((ulong)uVar1 >> 0x18);
    bStack_f4 = (byte)((ulong)uVar1 >> 0x20);
    uStack_f3 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_f2 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_f1 = (undefined1)((ulong)uVar1 >> 0x38);
    auVar3[1] = 0;
    auVar3[0] = local_98;
    auVar3[2] = uStack_97;
    auVar3[3] = 0;
    auVar3[4] = uStack_96;
    auVar3[5] = 0;
    auVar3[6] = uStack_95;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_94;
    auVar3[10] = uStack_93;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_92;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_91;
    auVar4[1] = 0;
    auVar4[0] = local_d8;
    auVar4[2] = uStack_d7;
    auVar4[3] = 0;
    auVar4[4] = uStack_d6;
    auVar4[5] = 0;
    auVar4[6] = uStack_d5;
    auVar4[7] = 0;
    auVar4[9] = 0;
    auVar4[8] = bStack_d4;
    auVar4[10] = uStack_d3;
    auVar4[0xb] = 0;
    auVar4[0xc] = uStack_d2;
    auVar4[0xd] = 0;
    auVar4[0xe] = uStack_d1;
    auVar3[0xf] = 0;
    auVar4[0xf] = 0;
    auVar4 = psubsw(auVar3,auVar4);
    auVar2[1] = 0;
    auVar2[0] = local_b8;
    auVar2[2] = uStack_b7;
    auVar2[3] = 0;
    auVar2[4] = uStack_b6;
    auVar2[5] = 0;
    auVar2[6] = uStack_b5;
    auVar2[7] = 0;
    auVar2[9] = 0;
    auVar2[8] = bStack_b4;
    auVar2[10] = uStack_b3;
    auVar2[0xb] = 0;
    auVar2[0xc] = uStack_b2;
    auVar2[0xd] = 0;
    auVar2[0xe] = uStack_b1;
    auVar5[1] = 0;
    auVar5[0] = local_f8;
    auVar5[2] = uStack_f7;
    auVar5[3] = 0;
    auVar5[4] = uStack_f6;
    auVar5[5] = 0;
    auVar5[6] = uStack_f5;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_f4;
    auVar5[10] = uStack_f3;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_f2;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_f1;
    auVar2[0xf] = 0;
    auVar5[0xf] = 0;
    auVar5 = psubsw(auVar2,auVar5);
    pmaddwd(auVar4,auVar4);
    pmaddwd(auVar5,auVar5);
    local_200 = local_200 + 8;
    local_208 = local_208 + 8;
    local_21c = local_21c + -1;
  }
  return iStack_23c + iStack_240 + iStack_244 + local_248;
}

Assistant:

static int SSE8x8_SSE2(const uint8_t* a, const uint8_t* b) {
  const __m128i zero = _mm_setzero_si128();
  int num_pairs = 4;
  __m128i sum = zero;
  int32_t tmp[4];
  while (num_pairs-- > 0) {
    const __m128i a0 = LOAD_8x16b(&a[BPS * 0]);
    const __m128i a1 = LOAD_8x16b(&a[BPS * 1]);
    const __m128i b0 = LOAD_8x16b(&b[BPS * 0]);
    const __m128i b1 = LOAD_8x16b(&b[BPS * 1]);
    // subtract
    const __m128i c0 = _mm_subs_epi16(a0, b0);
    const __m128i c1 = _mm_subs_epi16(a1, b1);
    // multiply/accumulate with self
    const __m128i d0 = _mm_madd_epi16(c0, c0);
    const __m128i d1 = _mm_madd_epi16(c1, c1);
    // collect
    const __m128i sum01 = _mm_add_epi32(d0, d1);
    sum = _mm_add_epi32(sum, sum01);
    a += 2 * BPS;
    b += 2 * BPS;
  }
  _mm_storeu_si128((__m128i*)tmp, sum);
  return (tmp[3] + tmp[2] + tmp[1] + tmp[0]);
}